

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetisWriter.cc
# Opt level: O3

ssize_t __thiscall MetisWriter::write(MetisWriter *this,int __fd,void *__buf,size_t __n)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  ostream *poVar2;
  ssize_t sVar3;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ofstream *outputfile;
  undefined4 in_register_00000034;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> neighbors;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  outputfile = &(this->super_Writer).outputFileBuffer;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)outputfile);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  sVar3 = std::ostream::flush();
  pvVar1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
           ((undefined8 *)CONCAT44(in_register_00000034,__fd))[1];
  for (__x = *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)
              CONCAT44(in_register_00000034,__fd); __x != pvVar1; __x = __x + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_38,__x);
    writeMetisLine(outputfile,&local_38);
    sVar3 = extraout_RAX;
    if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      sVar3 = extraout_RAX_00;
    }
  }
  return sVar3;
}

Assistant:

void MetisWriter::write(std::vector< std::vector<uint64_t> > adj_list,
        uint64_t vertices,
        uint64_t edges) {
    outputFileBuffer << vertices << " " << edges << std::endl;
    for (std::vector<uint64_t> neighbors : adj_list) {
        writeMetisLine(&outputFileBuffer, neighbors);
    }
}